

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2_builder.cpp
# Opt level: O0

void fillBlock(uint32_t *block,UChar32 start,UChar32 limit,uint32_t value,uint32_t initialValue,
              UBool overwrite)

{
  uint32_t *pLimit;
  UBool overwrite_local;
  uint32_t initialValue_local;
  uint32_t value_local;
  UChar32 limit_local;
  UChar32 start_local;
  uint32_t *block_local;
  
  _limit_local = block + start;
  if (overwrite == '\0') {
    for (; _limit_local < block + limit; _limit_local = _limit_local + 1) {
      if (*_limit_local == initialValue) {
        *_limit_local = value;
      }
    }
  }
  else {
    while (_limit_local < block + limit) {
      *_limit_local = value;
      _limit_local = _limit_local + 1;
    }
  }
  return;
}

Assistant:

static void
fillBlock(uint32_t *block, UChar32 start, UChar32 limit,
          uint32_t value, uint32_t initialValue, UBool overwrite) {
    uint32_t *pLimit;

    pLimit=block+limit;
    block+=start;
    if(overwrite) {
        while(block<pLimit) {
            *block++=value;
        }
    } else {
        while(block<pLimit) {
            if(*block==initialValue) {
                *block=value;
            }
            ++block;
        }
    }
}